

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O1

void __thiscall cmExprParserHelper::Error(cmExprParserHelper *this,char *str)

{
  size_t sVar1;
  ostream *poVar2;
  ostringstream ostr;
  undefined1 auStack_1b8 [8];
  long *local_1b0 [2];
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  if (str == (char *)0x0) {
    std::ios::clear((int)(auStack_1b8 + (long)*(_func_int **)(local_190._0_8_ + -0x18)) + 0x28);
  }
  else {
    sVar1 = strlen(str);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,str,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," (",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->ErrorString,(string *)local_1b0);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void cmExprParserHelper::Error(const char* str)
{
  unsigned long pos = static_cast<unsigned long>(this->InputBufferPos);
  std::ostringstream ostr;
  ostr << str << " (" << pos << ")";
  this->ErrorString = ostr.str();
}